

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O3

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
mxx::impl::
split<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,std::less<TwoBSA<unsigned_long>>>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,impl *this,
          long begin,long *end,long param_5)

{
  ulong *puVar1;
  ulong uVar2;
  unsigned_long uVar3;
  ulong uVar4;
  __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
  _Var5;
  ulong uVar6;
  ulong uVar7;
  size_type __n;
  ulong uVar8;
  ulong uVar9;
  pointer puVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  pair<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>,___gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>_>
  pVar15;
  int rank;
  allocator_type local_61;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_60;
  value_type_conflict1 local_58;
  ulong local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  __n = (size_type)*(int *)(param_5 + 0x10);
  if ((end[1] - *end >> 3) * -0x5555555555555555 - (__n - 1) != 0) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_58);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",local_58 & 0xffffffff,
           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
           ,0xe9,"split","splitters.size() == (size_t)comm.size() - 1");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
    __n = (size_type)*(int *)(param_5 + 0x10);
  }
  local_58 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,__n,&local_58,&local_61);
  uVar4 = (begin - (long)this >> 3) * -0x5555555555555555;
  lVar11 = *end;
  local_50 = uVar4;
  if (end[1] - lVar11 == 0) {
    puVar10 = (__return_storage_ptr__->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
  }
  else {
    uVar8 = (end[1] - lVar11 >> 3) * -0x5555555555555555;
    local_38 = (ulong)*(int *)(param_5 + 0x10);
    uVar4 = 0;
    local_60 = __return_storage_ptr__;
    local_48 = begin;
    local_40 = param_5;
    do {
      puVar1 = (ulong *)(lVar11 + uVar4 * 0x18);
      uVar14 = uVar4 + 1;
      uVar12 = 1;
      if (uVar14 < uVar8) {
        uVar9 = *puVar1;
        uVar13 = 1;
        do {
          uVar12 = (uint)uVar13;
          uVar13 = *(ulong *)(lVar11 + uVar14 * 0x18);
          if ((uVar9 < uVar13) ||
             ((uVar9 == uVar13 && (puVar1[1] < *(ulong *)(lVar11 + uVar14 * 0x18 + 8))))) break;
          uVar12 = uVar12 + 1;
          uVar13 = (ulong)uVar12;
          uVar14 = uVar13 + uVar4;
        } while (uVar14 < uVar8);
      }
      pVar15 = std::
               __equal_range<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,TwoBSA<unsigned_long>,__gnu_cxx::__ops::_Iter_comp_val<std::less<TwoBSA<unsigned_long>>>,__gnu_cxx::__ops::_Val_comp_iter<std::less<TwoBSA<unsigned_long>>>>
                         (this,local_48);
      _Var5 = pVar15.second._M_current;
      puVar10 = (local_60->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
      uVar3 = ((long)pVar15.first._M_current._M_current - (long)this >> 3) * -0x5555555555555555 +
              puVar10[uVar4];
      puVar10[uVar4] = uVar3;
      uVar8 = ((long)_Var5._M_current - (long)pVar15.first._M_current >> 3) * -0x5555555555555555;
      if (uVar12 != 0) {
        uVar9 = (uVar3 + uVar8) / (ulong)(uVar12 + 1) + 1;
        lVar11 = uVar4 << 0x20;
        uVar13 = 0;
        do {
          uVar2 = puVar10[uVar4 + uVar13];
          uVar6 = local_50 / local_38 + (ulong)((ulong)(lVar11 >> 0x20) < local_50 % local_38);
          uVar7 = uVar6 - uVar2;
          if (uVar6 < uVar2 || uVar7 == 0) {
            uVar7 = 0;
          }
          else {
            if (uVar7 <= uVar9) {
              uVar7 = uVar9;
            }
            if (uVar8 < uVar7) {
              uVar7 = uVar8;
            }
            uVar8 = uVar8 - uVar7;
          }
          puVar10[uVar4 + uVar13] = uVar7 + uVar2;
          uVar13 = uVar13 + 1;
          lVar11 = lVar11 + 0x100000000;
        } while (uVar12 != uVar13);
      }
      puVar10[uVar14] = puVar10[uVar14] + uVar8;
      lVar11 = *end;
      uVar8 = (end[1] - lVar11 >> 3) * -0x5555555555555555;
      this = (impl *)_Var5._M_current;
      uVar4 = uVar14;
    } while (uVar14 < uVar8);
    uVar4 = (local_48 - (long)_Var5._M_current >> 3) * -0x5555555555555555;
    __return_storage_ptr__ = local_60;
    param_5 = local_40;
  }
  puVar10[(long)*(int *)(param_5 + 0x10) + -1] =
       puVar10[(long)*(int *)(param_5 + 0x10) + -1] + uVar4;
  uVar4 = 0;
  for (; puVar10 !=
         (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
         ._M_impl.super__Vector_impl_data._M_finish; puVar10 = puVar10 + 1) {
    uVar4 = uVar4 + *puVar10;
  }
  if (uVar4 != local_50) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_58);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",local_58 & 0xffffffff,
           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
           ,0x114,"split",
           "std::accumulate(send_counts.begin(), send_counts.end(), 0ull) == local_size");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<size_t> split(_Iterator begin, _Iterator end, _Compare comp, const std::vector<typename std::iterator_traits<_Iterator>::value_type>& splitters, const mxx::comm& comm) {
    // 5. locally find splitter positions in data
    //    (if an identical splitter appears at least three times (or more),
    //    then split the intermediary buckets evenly) => send_counts
    MXX_ASSERT(splitters.size() == (size_t)comm.size() - 1);
    std::vector<size_t> send_counts(comm.size(), 0);
    _Iterator pos = begin;
    size_t local_size = std::distance(begin, end);
    partition::block_decomposition<std::size_t> local_part(local_size, comm.size(), comm.rank());
    for (std::size_t i = 0; i < splitters.size();) {
        // get the number of splitters which are equal starting from `i`
        unsigned int split_by = 1;
        while (i+split_by < splitters.size()
               && !comp(splitters[i], splitters[i+split_by])) {
            ++split_by;
        }

        // get the range of equal elements
        std::pair<_Iterator, _Iterator> eqr = std::equal_range(pos, end, splitters[i], comp);

        // assign smaller elements to processor left of splitter (= `i`)
        send_counts[i] += std::distance(pos, eqr.first);
        pos = eqr.first;

        // split equal elements fairly across processors
        std::size_t eq_size = std::distance(pos, eqr.second);
        // try to split approx equal:
        std::size_t eq_size_split = (eq_size + send_counts[i]) / (split_by+1) + 1;
        for (unsigned int j = 0; j < split_by; ++j) {
            // TODO: this kind of splitting is not `stable` (need other strategy
            // to mak such splitting stable across processors)
            std::size_t out_size = 0;
            if (send_counts[i+j] < local_part.local_size(i+j)) {
                // try to distribute fairly
                out_size = std::min(std::max(local_part.local_size(i+j) - send_counts[i+j], eq_size_split), eq_size);
                eq_size -= out_size;
            }
            send_counts[i+j] += out_size;
        }
        // assign remaining elements to next processor
        send_counts[i+split_by] += eq_size;
        i += split_by;
        pos = eqr.second;
    }
    // send last elements to last processor
    std::size_t out_size = std::distance(pos, end);
    send_counts[comm.size() - 1] += out_size;
    MXX_ASSERT(std::accumulate(send_counts.begin(), send_counts.end(), 0ull) == local_size);
    return send_counts;
}